

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

TimingControl * __thiscall
slang::ast::ContinuousAssignSymbol::getDelay(ContinuousAssignSymbol *this)

{
  Scope *pSVar1;
  SyntaxNode *pSVar2;
  TimingControlSyntax *pTVar3;
  int iVar4;
  ContinuousAssignSyntax *pCVar5;
  undefined4 extraout_var;
  Expression *pEVar7;
  bool bVar8;
  LookupLocation LVar9;
  ExpressionVarVisitor visitor;
  ASTContext context;
  ExpressionVarVisitor local_51;
  ASTContext local_50;
  TimingControl *pTVar6;
  
  if ((this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged == true) {
LAB_001cc0a2:
    pTVar6 = (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
             _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload.
             _M_value;
  }
  else {
    pSVar1 = (this->super_Symbol).parentScope;
    pSVar2 = (this->super_Symbol).originatingSyntax;
    if ((pSVar2 == (SyntaxNode *)0x0 || pSVar1 == (Scope *)0x0) ||
       (pSVar2 = pSVar2->parent, pSVar2 == (SyntaxNode *)0x0)) {
LAB_001cc138:
      (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged = true;
    }
    else {
      pCVar5 = slang::syntax::SyntaxNode::as<slang::syntax::ContinuousAssignSyntax>(pSVar2);
      pTVar3 = pCVar5->delay;
      if (pTVar3 != (TimingControlSyntax *)0x0) {
        LVar9 = LookupLocation::before(&this->super_Symbol);
        local_50.lookupIndex = LVar9.index;
        local_50.flags.m_bits = 0x80;
        local_50.instanceOrProc = (Symbol *)0x0;
        local_50.firstTempVar = (TempVarSymbol *)0x0;
        local_50.randomizeDetails = (RandomizeDetails *)0x0;
        local_50.assertionInstance = (AssertionInstanceDetails *)0x0;
        local_50.scope.ptr = pSVar1;
        if (LVar9.scope != pSVar1 && LVar9.scope != (Scope *)0x0) {
          assert::assertFailed
                    ("!lookupLocation.getScope() || lookupLocation.getScope() == &scope",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTContext.h"
                     ,0x119,
                     "slang::ast::ASTContext::ASTContext(const Scope &, LookupLocation, bitmask<ASTFlags>)"
                    );
        }
        iVar4 = TimingControl::bind((int)pTVar3,(sockaddr *)&local_50,local_50.lookupIndex);
        pTVar6 = (TimingControl *)CONCAT44(extraout_var,iVar4);
        bVar8 = (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
                _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>.
                _M_engaged == false;
        if (bVar8) {
          (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
          _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged =
               true;
          (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
          _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload.
          _M_value = pTVar6;
        }
        else {
          (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
          _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload.
          _M_value = pTVar6;
          if (bVar8) {
            std::__throw_bad_optional_access();
          }
        }
        if ((pTVar6->kind == Delay3) && (pTVar6[1].syntax != (SyntaxNode *)0x0)) {
          pEVar7 = getAssignment(this);
          if (pEVar7->kind == Assignment) {
            pEVar7 = (Expression *)pEVar7[1].constant;
            local_51.anyVars = false;
            Expression::
            visitExpression<slang::ast::Expression_const,slang::ast::ExpressionVarVisitor&>
                      (pEVar7,pEVar7,&local_51);
            if (local_51.anyVars == true) {
              ASTContext::addDiag(&local_50,(DiagCode)0x190006,pEVar7->sourceRange);
            }
          }
        }
        goto LAB_001cc0a2;
      }
      if ((this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
          _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged ==
          false) goto LAB_001cc138;
    }
    (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
    super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload._M_value =
         (TimingControl *)0x0;
    pTVar6 = (TimingControl *)0x0;
  }
  return pTVar6;
}

Assistant:

const TimingControl* ContinuousAssignSymbol::getDelay() const {
    if (delay)
        return *delay;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    if (!scope || !syntax || !syntax->parent) {
        delay = nullptr;
        return nullptr;
    }

    auto delaySyntax = syntax->parent->as<ContinuousAssignSyntax>().delay;
    if (!delaySyntax) {
        delay = nullptr;
        return nullptr;
    }

    ASTContext context(*scope, LookupLocation::before(*this), ASTFlags::NonProcedural);
    delay = &TimingControl::bind(*delaySyntax, context);

    // A multi-delay is disallowed if the lhs references variables.
    auto& d = *delay.value();
    if (d.kind == TimingControlKind::Delay3) {
        auto& d3 = d.as<Delay3Control>();
        if (d3.expr2) {
            auto& expr = getAssignment();
            if (expr.kind == ExpressionKind::Assignment) {
                auto& left = expr.as<AssignmentExpression>().left();
                ExpressionVarVisitor visitor;
                left.visit(visitor);
                if (visitor.anyVars)
                    context.addDiag(diag::Delay3OnVar, left.sourceRange);
            }
        }
    }

    return *delay;
}